

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_2da2744::Impl::~Impl(Impl *this)

{
  ErrorHandler *pEVar1;
  _Manager_type p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int in_ESI;
  
  (this->super_Session)._vptr_Session = (_func_int **)&PTR__Impl_00a56098;
  dap::Chan<std::function<void_()>_>::close(&this->inbox,in_ESI);
  dap::ContentReader::close(&this->reader,in_ESI);
  dap::ContentWriter::close(&this->writer,in_ESI);
  if ((this->recvThread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  if ((this->dispatchThread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  std::condition_variable::~condition_variable(&(this->inbox).cv);
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~deque
            (&(this->inbox).queue.c);
  if (((this->dispatchThread)._M_id._M_thread == 0) && ((this->recvThread)._M_id._M_thread == 0)) {
    std::
    _Hashtable<const_dap::TypeInfo_*,_std::pair<const_dap::TypeInfo_*const,_std::function<void_(const_void_*,_const_dap::Error_*)>_>,_std::allocator<std::pair<const_dap::TypeInfo_*const,_std::function<void_(const_void_*,_const_dap::Error_*)>_>_>,_std::__detail::_Select1st,_std::equal_to<const_dap::TypeInfo_*>,_std::hash<const_dap::TypeInfo_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&(this->handlers).responseSentMap._M_h);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_dap::TypeInfo_*,_std::function<void_(const_void_*)>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_dap::TypeInfo_*,_std::function<void_(const_void_*)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&(this->handlers).eventMap._M_h);
    std::
    _Hashtable<long,_std::pair<const_long,_std::pair<const_dap::TypeInfo_*,_std::function<void_(const_void_*,_const_dap::Error_*)>_>_>,_std::allocator<std::pair<const_long,_std::pair<const_dap::TypeInfo_*,_std::function<void_(const_void_*,_const_dap::Error_*)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&(this->handlers).responseMap._M_h);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_dap::TypeInfo_*,_std::function<void_(const_void_*,_const_std::function<void_(const_dap::TypeInfo_*,_const_void_*)>_&,_const_std::function<void_(const_dap::TypeInfo_*,_const_dap::Error_&)>_&)>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_dap::TypeInfo_*,_std::function<void_(const_void_*,_const_std::function<void_(const_dap::TypeInfo_*,_const_void_*)>_&,_const_std::function<void_(const_dap::TypeInfo_*,_const_dap::Error_&)>_&)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&(this->handlers).requestMap._M_h);
    p_Var2 = (this->handlers).errorHandler.super__Function_base._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      pEVar1 = &(this->handlers).errorHandler;
      (*p_Var2)((_Any_data *)pEVar1,(_Any_data *)pEVar1,__destroy_functor);
    }
    p_Var3 = (this->writer).writer.super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Deque_base
              (&(this->reader).buf.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)
    ;
    p_Var3 = (this->reader).reader.super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      return;
    }
    return;
  }
  std::terminate();
}

Assistant:

~Impl() {
    inbox.close();
    reader.close();
    writer.close();
    if (recvThread.joinable()) {
      recvThread.join();
    }
    if (dispatchThread.joinable()) {
      dispatchThread.join();
    }
  }